

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkQueryUtil.cpp
# Opt level: O0

vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_> *
vk::getImageSparseMemoryRequirements
          (vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
           *__return_storage_ptr__,DeviceInterface *vk,VkDevice device,VkImage image)

{
  VkDevice pVVar1;
  VkDevice pVVar2;
  DeviceInterface *pDVar3;
  reference pvVar4;
  ulong uVar5;
  size_type sVar6;
  TestError *this;
  uint local_2c;
  VkDevice pVStack_28;
  deUint32 requirementsCount;
  VkDevice device_local;
  DeviceInterface *vk_local;
  VkImage image_local;
  vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  *requirements;
  
  local_2c = 0;
  pVStack_28 = device;
  device_local = (VkDevice)vk;
  vk_local = (DeviceInterface *)image.m_internal;
  image_local.m_internal = (deUint64)__return_storage_ptr__;
  std::
  vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  ::vector(__return_storage_ptr__);
  (**(code **)(*(long *)device_local + 0x80))(device_local,pVStack_28,vk_local,&local_2c,0);
  if (local_2c != 0) {
    std::
    vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
    ::resize(__return_storage_ptr__,(ulong)local_2c);
    pDVar3 = vk_local;
    pVVar2 = device_local;
    pVVar1 = pVStack_28;
    pvVar4 = std::
             vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
             ::operator[](__return_storage_ptr__,0);
    (**(code **)(*(long *)pVVar2 + 0x80))(pVVar2,pVVar1,pDVar3,&local_2c,pvVar4);
    uVar5 = (ulong)local_2c;
    sVar6 = std::
            vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
            ::size(__return_storage_ptr__);
    if (uVar5 != sVar6) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Returned sparse image memory requirements count changes between queries",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                 ,0x98);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VkSparseImageMemoryRequirements> getImageSparseMemoryRequirements(const DeviceInterface& vk, VkDevice device, VkImage image)
{
	deUint32								requirementsCount = 0;
	vector<VkSparseImageMemoryRequirements> requirements;

	vk.getImageSparseMemoryRequirements(device, image, &requirementsCount, DE_NULL);

	if (requirementsCount > 0)
	{
		requirements.resize(requirementsCount);
		vk.getImageSparseMemoryRequirements(device, image, &requirementsCount, &requirements[0]);

		if ((size_t)requirementsCount != requirements.size())
			TCU_FAIL("Returned sparse image memory requirements count changes between queries");
	}

	return requirements;
}